

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV2AnimationBlock(Parser *this,BaseNode *mesh)

{
  Animation *pAVar1;
  int iVar2;
  bool bVar3;
  Logger *pLVar4;
  byte *pbVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  char *message;
  Animation *anim;
  string temp;
  
  anim = &mesh->mAnim;
  pAVar1 = &mesh->mTargetAnim;
  iVar8 = 0;
LAB_003e0d49:
LAB_003e0d5d:
  do {
    while( true ) {
      pbVar5 = (byte *)this->filePtr;
      bVar7 = *pbVar5;
      if (bVar7 == 0x2a) break;
LAB_003e0ebf:
      if ((bVar7 - 0xc < 2) || (bVar7 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003e0f0f;
        this->iLineNumber = this->iLineNumber + 1;
        bVar3 = true;
      }
      else {
        if (bVar7 == 0x7b) {
          iVar8 = iVar8 + 1;
        }
        else if (bVar7 == 0x7d) {
          iVar8 = iVar8 + -1;
          if (iVar8 == 0) {
            this->filePtr = (char *)(pbVar5 + 1);
            SkipToNextToken(this);
            return;
          }
        }
        else if (bVar7 == 0) {
          LogError(this,"Encountered unexpected EOL while parsing a TM_ANIMATION chunk (Level 2)");
        }
LAB_003e0f0f:
        bVar3 = false;
      }
      this->bLastWasEndLine = bVar3;
      this->filePtr = (char *)(pbVar5 + 1);
    }
    this->filePtr = (char *)(pbVar5 + 1);
    bVar3 = TokenMatch<char_const>(&this->filePtr,"NODE_NAME",9);
    if (bVar3) break;
    bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_POS_TRACK",0x11);
    if (((!bVar3) &&
        (bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_POS_BEZIER",0x12), !bVar3)) &&
       (bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_POS_TCB",0xf), !bVar3)) {
      bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_SCALE_TRACK",0x13);
      if (((bVar3) ||
          (bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_SCALE_BEZIER",0x14), bVar3)) ||
         (bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_SCALE_TCB",0x11), bVar3)) {
        if (anim != pAVar1 && anim != (Animation *)0x0) {
          ParseLV3ScaleAnimationBlock(this,anim);
          goto LAB_003e0d5d;
        }
        pLVar4 = DefaultLogger::get();
        message = "ASE: Ignoring scaling channel in target animation";
      }
      else {
        bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_ROT_TRACK",0x11);
        if (((!bVar3) &&
            (bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_ROT_BEZIER",0x12), !bVar3)) &&
           (bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_ROT_TCB",0xf), !bVar3)) {
          pbVar5 = (byte *)this->filePtr;
          bVar7 = *pbVar5;
          goto LAB_003e0ebf;
        }
        if (anim != pAVar1 && anim != (Animation *)0x0) {
          ParseLV3RotAnimationBlock(this,anim);
          goto LAB_003e0d5d;
        }
        pLVar4 = DefaultLogger::get();
        message = "ASE: Ignoring rotation channel in target animation";
      }
      Logger::error(pLVar4,message);
LAB_003e0e33:
      SkipSection(this);
      goto LAB_003e0d5d;
    }
    if (anim == (Animation *)0x0) goto LAB_003e0e33;
    ParseLV3PosAnimationBlock(this,anim);
  } while( true );
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  bVar3 = ParseString(this,&temp,"*NODE_NAME");
  if (!bVar3) {
    SkipToNextToken(this);
  }
  lVar6 = std::__cxx11::string::find((char *)&temp,0x5d07ed);
  if (lVar6 == -1) goto LAB_003e0fb8;
  if (mesh->mType == Light) {
    iVar2 = *(int *)&mesh->field_0x154;
LAB_003e0f9a:
    anim = pAVar1;
    if (iVar2 == 1) goto LAB_003e0fb8;
  }
  else if (mesh->mType == Camera) {
    iVar2 = *(int *)&mesh[1].mName._M_dataplus._M_p;
    goto LAB_003e0f9a;
  }
  pLVar4 = DefaultLogger::get();
  Logger::error(pLVar4,
                "ASE: Found target animation channel but the node is neither a camera nor a spot light"
               );
  anim = (Animation *)0x0;
LAB_003e0fb8:
  std::__cxx11::string::~string((string *)&temp);
  goto LAB_003e0d49;
}

Assistant:

void Parser::ParseLV2AnimationBlock(ASE::BaseNode& mesh)
{
    AI_ASE_PARSER_INIT();

    ASE::Animation* anim = &mesh.mAnim;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                std::string temp;
                if(!ParseString(temp,"*NODE_NAME"))
                    SkipToNextToken();

                // If the name of the node contains .target it
                // represents an animated camera or spot light
                // target.
                if (std::string::npos != temp.find(".Target"))
                {
                    if  ((mesh.mType != BaseNode::Camera || ((ASE::Camera&)mesh).mCameraType != ASE::Camera::TARGET)  &&
                        ( mesh.mType != BaseNode::Light  || ((ASE::Light&)mesh).mLightType   != ASE::Light::TARGET))
                    {

                        ASSIMP_LOG_ERROR("ASE: Found target animation channel "
                            "but the node is neither a camera nor a spot light");
                        anim = NULL;
                    }
                    else anim = &mesh.mTargetAnim;
                }
                continue;
            }

            // position keyframes
            if (TokenMatch(filePtr,"CONTROL_POS_TRACK"  ,17)  ||
                TokenMatch(filePtr,"CONTROL_POS_BEZIER" ,18)  ||
                TokenMatch(filePtr,"CONTROL_POS_TCB"    ,15))
            {
                if (!anim)SkipSection();
                else ParseLV3PosAnimationBlock(*anim);
                continue;
            }
            // scaling keyframes
            if (TokenMatch(filePtr,"CONTROL_SCALE_TRACK"  ,19) ||
                TokenMatch(filePtr,"CONTROL_SCALE_BEZIER" ,20) ||
                TokenMatch(filePtr,"CONTROL_SCALE_TCB"    ,17))
            {
                if (!anim || anim == &mesh.mTargetAnim)
                {
                    // Target animation channels may have no rotation channels
                    ASSIMP_LOG_ERROR("ASE: Ignoring scaling channel in target animation");
                    SkipSection();
                }
                else ParseLV3ScaleAnimationBlock(*anim);
                continue;
            }
            // rotation keyframes
            if (TokenMatch(filePtr,"CONTROL_ROT_TRACK"  ,17) ||
                TokenMatch(filePtr,"CONTROL_ROT_BEZIER" ,18) ||
                TokenMatch(filePtr,"CONTROL_ROT_TCB"    ,15))
            {
                if (!anim || anim == &mesh.mTargetAnim)
                {
                    // Target animation channels may have no rotation channels
                    ASSIMP_LOG_ERROR("ASE: Ignoring rotation channel in target animation");
                    SkipSection();
                }
                else ParseLV3RotAnimationBlock(*anim);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","TM_ANIMATION");
    }
}